

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  int iVar1;
  void *pvVar2;
  stbi__context *in_RCX;
  stbi__result_info *in_RDX;
  stbi__result_info *in_RSI;
  int *in_RDI;
  undefined4 in_R8D;
  stbi__context *in_R9;
  undefined4 in_stack_00000008;
  stbi__result_info *in_stack_000004a0;
  int in_stack_000004ac;
  int *in_stack_000004b0;
  int *in_stack_000004b8;
  int *in_stack_000004c0;
  stbi__context *in_stack_000004c8;
  undefined4 in_stack_ffffffffffffffd0;
  stbi__context *in_stack_fffffffffffffff8;
  
  memset(in_R9,0,0xc);
  in_R9->img_x = 8;
  in_R9->img_n = 0;
  in_R9->img_y = 0;
  iVar1 = stbi__png_test((stbi__context *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
  if (iVar1 == 0) {
    iVar1 = stbi__bmp_test((stbi__context *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
    if (iVar1 == 0) {
      iVar1 = stbi__jpeg_test(in_RCX);
      if (iVar1 == 0) {
        iVar1 = stbi__pnm_test(in_R9);
        if (iVar1 == 0) {
          stbi__err("unknown image type");
          pvVar2 = (void *)0x0;
        }
        else {
          pvVar2 = stbi__pnm_load((stbi__context *)CONCAT44(req_comp,in_stack_00000008),
                                  &ri->bits_per_channel,(int *)in_stack_fffffffffffffff8,in_RDI,
                                  (int)((ulong)in_RSI >> 0x20),in_RDX);
        }
      }
      else {
        pvVar2 = stbi__jpeg_load(in_stack_fffffffffffffff8,in_RDI,&in_RSI->bits_per_channel,
                                 &in_RDX->bits_per_channel,(int)((ulong)in_RCX >> 0x20),
                                 (stbi__result_info *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
      }
    }
    else {
      pvVar2 = stbi__bmp_load(in_stack_000004c8,in_stack_000004c0,in_stack_000004b8,
                              in_stack_000004b0,in_stack_000004ac,in_stack_000004a0);
    }
  }
  else {
    pvVar2 = stbi__png_load((stbi__context *)comp,(int *)CONCAT44(req_comp,in_stack_00000008),
                            &ri->bits_per_channel,(int *)in_stack_fffffffffffffff8,
                            (int)((ulong)in_RDI >> 0x20),in_RSI);
  }
  return pvVar2;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}